

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

void xmlInitRMutex(xmlRMutexPtr tok)

{
  pthread_mutex_init((pthread_mutex_t *)tok,(pthread_mutexattr_t *)0x0);
  tok->held = 0;
  tok->waiters = 0;
  pthread_cond_init((pthread_cond_t *)&tok->cv,(pthread_condattr_t *)0x0);
  return;
}

Assistant:

void
xmlInitRMutex(xmlRMutexPtr tok) {
    (void) tok;

#ifdef HAVE_POSIX_THREADS
    pthread_mutex_init(&tok->lock, NULL);
    tok->held = 0;
    tok->waiters = 0;
    pthread_cond_init(&tok->cv, NULL);
#elif defined HAVE_WIN32_THREADS
    InitializeCriticalSection(&tok->cs);
#endif
}